

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mode5TransponderBasicData.cpp
# Opt level: O3

void __thiscall
KDIS::DATA_TYPE::Mode5TransponderBasicData::SetFigureOfMerit
          (Mode5TransponderBasicData *this,KUINT8 FOM)

{
  KException *this_00;
  KString local_40;
  
  if (FOM < 0x20) {
    this->m_ui8FigMerit = FOM;
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"SetFigureOfMerit","");
  KException::KException<char_const*>(this_00,&local_40,8,"Value must be between 0-31.");
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void Mode5TransponderBasicData::SetFigureOfMerit(KUINT8 FOM) noexcept(false)
{
    if( FOM > 31 )throw KException( __FUNCTION__, INVALID_DATA, "Value must be between 0-31." );
    m_ui8FigMerit = FOM;
}